

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_send_method(amqp_connection_state_t state,amqp_channel_t channel,amqp_method_number_t id,
                    void *decoded)

{
  int iVar1;
  amqp_time_t aVar2;
  void *in_RCX;
  amqp_method_number_t in_EDX;
  amqp_channel_t in_SI;
  amqp_connection_state_t in_RDI;
  amqp_time_t unaff_retaddr;
  
  aVar2 = amqp_time_infinite();
  iVar1 = amqp_send_method_inner
                    (in_RDI,in_SI,in_EDX,in_RCX,(int)(aVar2.time_point_ns >> 0x20),unaff_retaddr);
  return iVar1;
}

Assistant:

int amqp_send_method(amqp_connection_state_t state, amqp_channel_t channel,
                     amqp_method_number_t id, void *decoded) {
  return amqp_send_method_inner(state, channel, id, decoded, AMQP_SF_NONE,
                                amqp_time_infinite());
}